

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_class.c
# Opt level: O0

int oonf_class_extension_add(oonf_class_extension *ext)

{
  list_entity *plVar1;
  long lVar2;
  list_entity *plVar3;
  size_t sVar4;
  bool bVar5;
  oonf_class *local_c0;
  oonf_class *c;
  oonf_class_extension *ext_local;
  
  bVar5 = false;
  if ((ext->_node).next != (list_entity *)0x0) {
    bVar5 = (ext->_node).prev != (list_entity *)0x0;
  }
  if (bVar5) {
    ext_local._4_4_ = 0;
  }
  else {
    lVar2 = avl_find(&_classes_tree,ext->class_name);
    if (lVar2 == 0) {
      local_c0 = (oonf_class *)0x0;
    }
    else {
      local_c0 = (oonf_class *)(lVar2 + -0x28);
    }
    if (local_c0 == (oonf_class *)0x0) {
      if (((&log_global_mask)[_oonf_class_subsystem.logging] & 4) != 0) {
        oonf_log(4,_oonf_class_subsystem.logging,"src/base/oonf_class.c",0x10b,0,0,
                 "Unknown class %s for extension %s",ext->class_name,ext->ext_name);
      }
      ext_local._4_4_ = -1;
    }
    else if ((local_c0->_allocated == 0) || (ext->size == 0)) {
      plVar3 = &ext->_node;
      plVar1 = (local_c0->_extensions).prev;
      plVar3->next = &local_c0->_extensions;
      (ext->_node).prev = plVar1;
      (local_c0->_extensions).prev = plVar3;
      plVar1->next = plVar3;
      if (ext->size != 0) {
        _free_freelist(local_c0);
        ext->_offset = local_c0->total_size;
        sVar4 = _roundup(local_c0->total_size + ext->size);
        local_c0->total_size = sVar4;
        if (((&log_global_mask)[_oonf_class_subsystem.logging] & 1) != 0) {
          oonf_log(1,_oonf_class_subsystem.logging,"src/base/oonf_class.c",0x124,0,0,
                   "Class %s extended: %zu bytes, \'%s\' has offset %zu and length %zu\n",
                   local_c0->name,local_c0->total_size,ext->ext_name,ext->_offset,ext->size);
        }
      }
      ext_local._4_4_ = 0;
    }
    else {
      if (((&log_global_mask)[_oonf_class_subsystem.logging] & 4) != 0) {
        oonf_log(4,_oonf_class_subsystem.logging,"src/base/oonf_class.c",0x110,0,0,
                 "Class %s is already in use and cannot be extended",local_c0->name);
      }
      ext_local._4_4_ = -1;
    }
  }
  return ext_local._4_4_;
}

Assistant:

int
oonf_class_extension_add(struct oonf_class_extension *ext) {
  struct oonf_class *c;

  if (oonf_class_is_extension_registered(ext)) {
    /* already registered */
    return 0;
  }

  c = avl_find_element(&_classes_tree, ext->class_name, c, _node);
  if (c == NULL) {
    OONF_WARN(LOG_CLASS, "Unknown class %s for extension %s", ext->class_name, ext->ext_name);
    return -1;
  }

  if (c->_allocated != 0 && ext->size > 0) {
    OONF_WARN(LOG_CLASS, "Class %s is already in use and cannot be extended", c->name);
    return -1;
  }

  /* add to class extension list */
  list_add_tail(&c->_extensions, &ext->_node);

  if (ext->size > 0) {
    /* make sure freelist is empty */
    _free_freelist(c);

    /* old size is new offset */
    ext->_offset = c->total_size;

    /* calculate new size */
    c->total_size = _roundup(c->total_size + ext->size);

    OONF_DEBUG(LOG_CLASS,
      "Class %s extended: %" PRINTF_SIZE_T_SPECIFIER " bytes,"
      " '%s' has offset %" PRINTF_SIZE_T_SPECIFIER " and length %" PRINTF_SIZE_T_SPECIFIER "\n",
      c->name, c->total_size, ext->ext_name, ext->_offset, ext->size);
  }

  return 0;
}